

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorElement.cpp
# Opt level: O1

void __thiscall
iDynTree::SensorElement::SensorElement
          (SensorElement *this,XMLParserState *parserState,
          vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
          *sensors)

{
  long *local_80 [2];
  long local_70 [10];
  
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"sensor","");
  iDynTree::XMLElement::XMLElement(&this->super_XMLElement,parserState,(string *)local_80);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  *(undefined ***)this = &PTR__SensorElement_00143440;
  (this->m_info).super___shared_ptr<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<iDynTree::SensorElement::SensorInfo,std::allocator<iDynTree::SensorElement::SensorInfo>>
            (&(this->m_info).
              super___shared_ptr<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SensorInfo **)&this->m_info,
             (allocator<iDynTree::SensorElement::SensorInfo> *)local_80);
  this->m_sensors = sensors;
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=
            (&((this->m_info).
               super___shared_ptr<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_origin,(Transform *)local_80);
  return;
}

Assistant:

SensorElement::SensorElement(
        XMLParserState& parserState, 
        std::vector<std::shared_ptr<SensorHelper>>& sensors)
    : iDynTree::XMLElement(parserState, "sensor")
    , m_info(std::make_shared<SensorInfo>())
    , m_sensors(sensors)
    {
        // Defaulting the origin
        m_info->m_origin = Transform::Identity();
    }